

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O2

VarSet * __thiscall libDAI::VarSet::operator/=(VarSet *this,Var *n)

{
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  __position;
  
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,libDAI::Var,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->_vars).
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->_vars).
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_finish,n);
  if ((__position._M_current !=
       (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
       super__Vector_impl_data._M_finish) && ((__position._M_current)->_label == n->_label)) {
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::erase
              (&this->_vars,(const_iterator)__position._M_current);
    this->_statespace = this->_statespace / n->_states;
  }
  return this;
}

Assistant:

VarSet& operator/= ( const Var& n ) { 
                std::vector<Var>::iterator pos = lower_bound( _vars.begin(), _vars.end(), n );
                if( pos != _vars.end() )
                    if( *pos == n ) { // found variable, delete it
                        _vars.erase( pos ); 
                        _statespace /= n.states();
                    }
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
                return *this; 
            }